

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::Coroutine<void>::fulfill(Coroutine<void> *this,FixVoid<void> *value)

{
  bool bVar1;
  Void *value_00;
  ExceptionOr<kj::_::Void> local_1b8;
  Void *local_18;
  FixVoid<void> *value_local;
  Coroutine<void> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<void> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::_::Void>(local_18);
    ExceptionOr<kj::_::Void>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<kj::_::Void>::operator=(&this->result,&local_1b8);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_1b8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }